

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O1

run_container_t * run_container_from_array(array_container_t *c)

{
  uint uVar1;
  int iVar2;
  uint16_t *puVar3;
  rle16_t *prVar4;
  uint uVar5;
  int32_t size;
  run_container_t *prVar6;
  ushort uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  
  size = array_container_number_of_runs(c);
  prVar6 = run_container_create_given_capacity(size);
  uVar1 = c->cardinality;
  if ((ulong)uVar1 != 0) {
    if ((int)uVar1 < 1) {
      uVar7 = 0xfffe;
      uVar10 = 0xffffffff;
    }
    else {
      puVar3 = c->array;
      uVar10 = 0xffffffff;
      uVar8 = 0xfffffffe;
      uVar9 = 0;
      do {
        uVar7 = puVar3[uVar9];
        uVar5 = uVar10;
        if ((uVar8 + 1 != (uint)uVar7) && (uVar5 = (uint)uVar7, uVar10 != 0xffffffff)) {
          prVar4 = prVar6->runs;
          iVar2 = prVar6->n_runs;
          prVar4[iVar2].value = (uint16_t)uVar10;
          prVar4[iVar2].length = (short)uVar8 - (uint16_t)uVar10;
          prVar6->n_runs = iVar2 + 1;
        }
        uVar10 = uVar5;
        uVar7 = puVar3[uVar9];
        uVar8 = (uint)uVar7;
        uVar9 = uVar9 + 1;
      } while (uVar1 != uVar9);
    }
    prVar4 = prVar6->runs;
    iVar2 = prVar6->n_runs;
    prVar4[iVar2].value = (uint16_t)uVar10;
    prVar4[iVar2].length = uVar7 - (uint16_t)uVar10;
    prVar6->n_runs = iVar2 + 1;
  }
  return prVar6;
}

Assistant:

run_container_t *run_container_from_array(const array_container_t *c) {
    int32_t n_runs = array_container_number_of_runs(c);
    run_container_t *answer = run_container_create_given_capacity(n_runs);
    int prev = -2;
    int run_start = -1;
    int32_t card = c->cardinality;
    if (card == 0) return answer;
    for (int i = 0; i < card; ++i) {
        const uint16_t cur_val = c->array[i];
        if (cur_val != prev + 1) {
            // new run starts; flush old one, if any
            if (run_start != -1) add_run(answer, run_start, prev);
            run_start = cur_val;
        }
        prev = c->array[i];
    }
    // now prev is the last seen value
    add_run(answer, run_start, prev);
    // assert(run_container_cardinality(answer) == c->cardinality);
    return answer;
}